

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O2

void internal_search(Am_Object *cmd,Am_Which_Search_Direction dir)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Slot_Key key_00;
  Am_Am_Slot_Key key;
  Am_Value_List old_sel_list;
  Am_Object sel_widget;
  Am_Object search_widget;
  Am_Object item;
  Am_Assoc as;
  Am_Value_List slots_to_item;
  Am_Value v;
  Am_Value_List slots_and_values_used;
  Am_Assoc local_38;
  
  Am_Object::Get_Object((Am_Object *)&slots_to_item,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&search_widget,(Am_Slot_Flags)&slots_to_item);
  Am_Object::~Am_Object((Am_Object *)&slots_to_item);
  pAVar2 = Am_Object::Get(&search_widget,0x197,0);
  Am_Object::Am_Object(&sel_widget,pAVar2);
  pAVar2 = Am_Object::Get(&search_widget,Am_SLOTS_TO_ITEMS,0);
  Am_Value_List::Am_Value_List(&slots_to_item,pAVar2);
  as.data = (Am_Assoc_Data *)0x0;
  key.value = 0;
  item.data = (Am_Object_Data *)0x0;
  v.type = 0;
  v.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value_List::Am_Value_List(&slots_and_values_used);
  Am_Value_List::Start(&slots_to_item);
  while( true ) {
    bVar1 = Am_Value_List::Last(&slots_to_item);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&slots_to_item);
    Am_Assoc::operator=(&as,pAVar2);
    Am_Assoc::Value_2((Am_Assoc *)&old_sel_list);
    Am_Object::operator=(&item,(Am_Value *)&old_sel_list);
    Am_Value::~Am_Value((Am_Value *)&old_sel_list);
    key_00 = (Am_Slot_Key)&item;
    Am_Object::Get_Object((Am_Object *)&old_sel_list,key_00,(ulong)Am_USE_ITEM);
    pAVar2 = Am_Object::Get((Am_Object *)&old_sel_list,0x169,0);
    bVar1 = Am_Value::Valid(pAVar2);
    Am_Object::~Am_Object((Am_Object *)&old_sel_list);
    if (bVar1) {
      Am_Assoc::Value_1((Am_Assoc *)&old_sel_list);
      Am_Am_Slot_Key::operator=(&key,(Am_Value *)&old_sel_list);
      Am_Value::~Am_Value((Am_Value *)&old_sel_list);
      if (key.value == 0xb) {
        Am_Object::Get_Object((Am_Object *)&old_sel_list,key_00,(ulong)Am_ITEM_VALUE);
        pAVar2 = Am_Object::Get((Am_Object *)&old_sel_list,0x169,0);
        Am_Value::operator=(&v,pAVar2);
      }
      else {
        Am_Object::Get_Object((Am_Object *)&old_sel_list,key_00,(ulong)Am_ITEM_VALUE);
        pAVar2 = Am_Object::Get((Am_Object *)&old_sel_list,0xfa,0);
        Am_Value::operator=(&v,pAVar2);
      }
      Am_Object::~Am_Object((Am_Object *)&old_sel_list);
      old_sel_list.item = (Am_List_Item *)(ulong)key.value;
      old_sel_list.data._0_2_ = 0x4015;
      Am_Assoc::Am_Assoc(&local_38,(Am_Value *)&old_sel_list,&v);
      value = Am_Assoc::operator_cast_to_Am_Wrapper_(&local_38);
      Am_Value_List::Add(&slots_and_values_used,value,Am_TAIL,true);
      Am_Assoc::~Am_Assoc(&local_38);
      Am_Value::~Am_Value((Am_Value *)&old_sel_list);
    }
    Am_Value_List::Next(&slots_to_item);
  }
  pAVar2 = Am_Object::Get(&sel_widget,0x169,0);
  Am_Value_List::Am_Value_List(&old_sel_list,pAVar2);
  internal_search_using(cmd,dir,&sel_widget,&old_sel_list,&slots_and_values_used);
  Am_Value_List::~Am_Value_List(&old_sel_list);
  Am_Value_List::~Am_Value_List(&slots_and_values_used);
  Am_Value::~Am_Value(&v);
  Am_Object::~Am_Object(&item);
  Am_Assoc::~Am_Assoc(&as);
  Am_Value_List::~Am_Value_List(&slots_to_item);
  Am_Object::~Am_Object(&sel_widget);
  Am_Object::~Am_Object(&search_widget);
  return;
}

Assistant:

void
internal_search(Am_Object &cmd, Am_Which_Search_Direction dir)
{
  Am_Object search_widget = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object sel_widget = search_widget.Get(Am_SELECTION_WIDGET);
  Am_Value_List slots_to_item = search_widget.Get(Am_SLOTS_TO_ITEMS);

  Am_Assoc as;
  Am_Am_Slot_Key key;
  Am_Object item;
  Am_Value v;
  Am_Value_List slots_and_values_used;
  for (slots_to_item.Start(); !slots_to_item.Last(); slots_to_item.Next()) {
    as = slots_to_item.Get();
    item = as.Value_2();
    if (item.Get_Object(Am_USE_ITEM).Get(Am_VALUE).Valid()) {
      key = as.Value_1();
      if ((Am_Slot_Key)key == Am_PROTOTYPE)
        v = item.Get_Object(Am_ITEM_VALUE).Get(Am_VALUE);
      else
        v = item.Get_Object(Am_ITEM_VALUE).Get(Am_VALUES);
      slots_and_values_used.Add(Am_Assoc(key, v));
    }
  }
  Am_Value_List old_sel_list = sel_widget.Get(Am_VALUE);
  internal_search_using(cmd, dir, sel_widget, old_sel_list,
                        slots_and_values_used);
}